

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie_swap.cpp
# Opt level: O1

int32_t ucptrie_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                       UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  int iVar6;
  ushort uVar7;
  uint uVar8;
  ushort uVar9;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((inData == (void *)0x0 || ds == (UDataSwapper *)0x0) ||
       (outData == (void *)0x0 && -1 < length)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else if ((uint)length < 0x10) {
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    }
    else {
      uVar4 = (*ds->readUInt32)(*inData);
      uVar1 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 4));
      uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 6));
      uVar3 = (*ds->readUInt16)(*(uint16_t *)((long)inData + 8));
      uVar7 = 0x40;
      if ((uVar1 >> 6 & 3) == 0) {
        uVar7 = 0x400;
      }
      if ((((uVar4 == 0x54726933) && ((uVar1 >> 6 & 3) < 2)) &&
          (uVar9 = uVar1 & 7, uVar9 < 3 && (uVar1 & 0x38) == 0)) && (uVar7 <= uVar2)) {
        uVar8 = (uint)uVar3 | (uVar1 & 0xf000) << 4;
        if (0x7f < uVar8) {
          uVar5 = uVar8;
          if (uVar9 != 2) {
            if (uVar9 == 1) {
              uVar5 = uVar8 * 4;
            }
            else {
              uVar5 = uVar8 * 2;
            }
          }
          iVar6 = (uint)uVar2 * 2 + 0x10 + uVar5;
          if (-1 < length) {
            if (length < iVar6) {
              *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
            }
            else {
              uVar5 = (uint)uVar2 + (uint)uVar2;
              (*ds->swapArray32)(ds,inData,4,outData,pErrorCode);
              (*ds->swapArray16)(ds,(void *)((long)inData + 4),0xc,(void *)((long)outData + 4),
                                 pErrorCode);
              if ((uVar1 & 7) == 2) {
                (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),uVar5,
                                   (void *)((long)outData + 0x10),pErrorCode);
                if (inData != outData) {
                  memmove((void *)((long)outData + 0x10 + (ulong)uVar2 * 0x10),
                          (void *)((long)inData + 0x10 + (ulong)uVar2 * 0x10),(ulong)uVar8);
                }
              }
              else if ((uVar1 & 7) == 1) {
                (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),uVar5,
                                   (void *)((long)outData + 0x10),pErrorCode);
                (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar5 + 0x10),uVar8 << 2,
                                   (void *)((long)outData + (ulong)uVar5 + 0x10),pErrorCode);
              }
              else {
                (*ds->swapArray16)(ds,(void *)((long)inData + 0x10),(uVar8 + uVar2) * 2,
                                   (void *)((long)outData + 0x10),pErrorCode);
              }
            }
            if (length < iVar6) {
              return 0;
            }
          }
          return iVar6;
        }
      }
      *pErrorCode = U_INVALID_FORMAT_ERROR;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_swap(const UDataSwapper *ds,
             const void *inData, int32_t length, void *outData,
             UErrorCode *pErrorCode) {
    const UCPTrieHeader *inTrie;
    UCPTrieHeader trie;
    int32_t dataLength, size;
    UCPTrieValueWidth valueWidth;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==nullptr || inData==nullptr || (length>=0 && outData==nullptr)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* setup and swapping */
    if(length>=0 && length<(int32_t)sizeof(UCPTrieHeader)) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    inTrie=(const UCPTrieHeader *)inData;
    trie.signature=ds->readUInt32(inTrie->signature);
    trie.options=ds->readUInt16(inTrie->options);
    trie.indexLength=ds->readUInt16(inTrie->indexLength);
    trie.dataLength = ds->readUInt16(inTrie->dataLength);

    UCPTrieType type = (UCPTrieType)((trie.options >> 6) & 3);
    valueWidth = (UCPTrieValueWidth)(trie.options & UCPTRIE_OPTIONS_VALUE_BITS_MASK);
    dataLength = ((int32_t)(trie.options & UCPTRIE_OPTIONS_DATA_LENGTH_MASK) << 4) | trie.dataLength;

    int32_t minIndexLength = type == UCPTRIE_TYPE_FAST ?
        UCPTRIE_BMP_INDEX_LENGTH : UCPTRIE_SMALL_INDEX_LENGTH;
    if( trie.signature!=UCPTRIE_SIG ||
        type > UCPTRIE_TYPE_SMALL ||
        (trie.options & UCPTRIE_OPTIONS_RESERVED_MASK) != 0 ||
        valueWidth > UCPTRIE_VALUE_BITS_8 ||
        trie.indexLength < minIndexLength ||
        dataLength < ASCII_LIMIT
    ) {
        *pErrorCode=U_INVALID_FORMAT_ERROR; /* not a UCPTrie */
        return 0;
    }

    size=sizeof(UCPTrieHeader)+trie.indexLength*2;
    switch(valueWidth) {
    case UCPTRIE_VALUE_BITS_16:
        size+=dataLength*2;
        break;
    case UCPTRIE_VALUE_BITS_32:
        size+=dataLength*4;
        break;
    case UCPTRIE_VALUE_BITS_8:
        size+=dataLength;
        break;
    default:
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(length>=0) {
        UCPTrieHeader *outTrie;

        if(length<size) {
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

        outTrie=(UCPTrieHeader *)outData;

        /* swap the header */
        ds->swapArray32(ds, &inTrie->signature, 4, &outTrie->signature, pErrorCode);
        ds->swapArray16(ds, &inTrie->options, 12, &outTrie->options, pErrorCode);

        /* swap the index and the data */
        switch(valueWidth) {
        case UCPTRIE_VALUE_BITS_16:
            ds->swapArray16(ds, inTrie+1, (trie.indexLength+dataLength)*2, outTrie+1, pErrorCode);
            break;
        case UCPTRIE_VALUE_BITS_32:
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            ds->swapArray32(ds, (const uint16_t *)(inTrie+1)+trie.indexLength, dataLength*4,
                                     (uint16_t *)(outTrie+1)+trie.indexLength, pErrorCode);
            break;
        case UCPTRIE_VALUE_BITS_8:
            ds->swapArray16(ds, inTrie+1, trie.indexLength*2, outTrie+1, pErrorCode);
            if(inTrie!=outTrie) {
                uprv_memmove((outTrie+1)+trie.indexLength, (inTrie+1)+trie.indexLength, dataLength);
            }
            break;
        default:
            *pErrorCode=U_INVALID_FORMAT_ERROR;
            return 0;
        }
    }

    return size;
}